

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O2

void __thiscall
t_java_generator::generate_service_async_client(t_java_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *os;
  int *piVar1;
  t_function *ptVar2;
  pointer pptVar3;
  int iVar4;
  ostream *poVar5;
  t_java_generator *this_00;
  char *pcVar6;
  t_type *ptVar7;
  pointer pptVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  pointer local_248;
  t_struct *local_240;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  string local_1f8;
  t_type *local_1d8;
  t_struct *local_1d0;
  string local_1c8;
  string funname;
  string funclassname;
  string sep;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string javaname;
  string args_name;
  string extends;
  string extends_client;
  string local_b0;
  string result_name;
  
  std::__cxx11::string::string
            ((string *)&extends,"org.apache.thrift.async.TAsyncClient",(allocator *)&extends_client)
  ;
  std::__cxx11::string::string((string *)&extends_client,"",(allocator *)&funname);
  if (tservice->extends_ != (t_service *)0x0) {
    type_name_abi_cxx11_(&sep,this,&tservice->extends_->super_t_type,false,false,false,false);
    std::operator+(&funname,&sep,".AsyncClient");
    std::__cxx11::string::operator=((string *)&extends,(string *)&funname);
    std::__cxx11::string::~string((string *)&funname);
    std::__cxx11::string::~string((string *)&sep);
  }
  os = &this->f_service_;
  poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar5 = std::operator<<(poVar5,"public static class AsyncClient extends ");
  poVar5 = std::operator<<(poVar5,(string *)&extends);
  poVar5 = std::operator<<(poVar5," implements AsyncIface {");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar5 = std::operator<<(poVar5,
                           "public static class Factory implements org.apache.thrift.async.TAsyncClientFactory<AsyncClient> {"
                          );
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar5 = std::operator<<(poVar5,
                           "  private org.apache.thrift.async.TAsyncClientManager clientManager;");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar5 = std::operator<<(poVar5,
                           "  private org.apache.thrift.protocol.TProtocolFactory protocolFactory;")
  ;
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar5 = std::operator<<(poVar5,
                           "  public Factory(org.apache.thrift.async.TAsyncClientManager clientManager, org.apache.thrift.protocol.TProtocolFactory protocolFactory) {"
                          );
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar5 = std::operator<<(poVar5,"    this.clientManager = clientManager;");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar5 = std::operator<<(poVar5,"    this.protocolFactory = protocolFactory;");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar5 = std::operator<<(poVar5,"  }");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar5 = std::operator<<(poVar5,
                           "  public AsyncClient getAsyncClient(org.apache.thrift.transport.TNonblockingTransport transport) {"
                          );
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar5 = std::operator<<(poVar5,
                           "    return new AsyncClient(protocolFactory, clientManager, transport);")
  ;
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar5 = std::operator<<(poVar5,"  }");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar5 = std::operator<<(poVar5,"}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar5 = std::operator<<(poVar5,
                           "public AsyncClient(org.apache.thrift.protocol.TProtocolFactory protocolFactory, org.apache.thrift.async.TAsyncClientManager clientManager, org.apache.thrift.transport.TNonblockingTransport transport) {"
                          );
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar5 = std::operator<<(poVar5,"  super(protocolFactory, clientManager, transport);");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
  poVar5 = std::operator<<(poVar5,"}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&functions,&tservice->functions_)
  ;
  while( true ) {
    if (functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
        super__Vector_impl_data._M_finish) break;
    local_248 = functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    std::__cxx11::string::string
              ((string *)&funname,
               (string *)
               &(*functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                  super__Vector_impl_data._M_start)->name_);
    std::__cxx11::string::string((string *)&sep,"_",(allocator *)&javaname);
    std::__cxx11::string::string((string *)&javaname,(string *)&funname);
    if (this->fullcamel_style_ == true) {
      std::__cxx11::string::assign((char *)&sep);
      this_00 = (t_java_generator *)&javaname;
      std::__cxx11::string::string((string *)&stack0xffffffffffffffb0,(string *)this_00);
      as_camel_case(&funclassname,this_00,(string *)&stack0xffffffffffffffb0,true);
      std::__cxx11::string::operator=((string *)&javaname,(string *)&funclassname);
      std::__cxx11::string::~string((string *)&funclassname);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    }
    pptVar3 = local_248;
    local_1d8 = (*local_248)->returntype_;
    local_240 = (*local_248)->arglist_;
    std::operator+(&funclassname,&funname,"_call");
    ptVar2 = *pptVar3;
    local_1d0 = ptVar2->xceptions_;
    std::operator+(&args_name,&ptVar2->name_,"_args");
    std::operator+(&result_name,&(*pptVar3)->name_,"_result");
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar5 = std::operator<<(poVar5,"public ");
    ptVar2 = *local_248;
    std::__cxx11::string::string((string *)&stack0xffffffffffffff90,"",(allocator *)&local_268);
    ptVar7 = (t_type *)&stack0xffffffffffffff90;
    function_signature_async(&local_1f8,this,ptVar2,false,(string *)&stack0xffffffffffffff90);
    poVar5 = std::operator<<(poVar5,(string *)&local_1f8);
    poVar5 = std::operator<<(poVar5," throws org.apache.thrift.TException {");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar5 = std::operator<<(poVar5,"  checkReady();");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = std::operator<<(poVar5,(string *)&funclassname);
    std::operator+(&local_268," method_call = new ",&funclassname);
    std::operator+(&local_1f8,&local_268,"(");
    poVar5 = std::operator<<(poVar5,(string *)&local_1f8);
    async_argument_list_abi_cxx11_(&local_238,this,*local_248,local_240,ptVar7,false);
    poVar5 = std::operator<<(poVar5,(string *)&local_238);
    poVar5 = std::operator<<(poVar5,", this, ___protocolFactory, ___transport);");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_268);
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar5 = std::operator<<(poVar5,"  this.___currentMethod = method_call;");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar5 = std::operator<<(poVar5,"  ___manager.call(method_call);");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar5 = std::operator<<(poVar5,"}");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<((ostream *)os,(string *)&::endl_abi_cxx11_);
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::operator+(&local_218,"public static class ",&funclassname);
    std::operator+(&local_238,&local_218," extends org.apache.thrift.async.TAsyncMethodCall<");
    ptVar7 = (t_type *)0x0;
    type_name_abi_cxx11_(&local_1c8,this,(*local_248)->returntype_,true,false,false,false);
    std::operator+(&local_268,&local_238,&local_1c8);
    std::operator+(&local_1f8,&local_268,"> {");
    poVar5 = std::operator<<(poVar5,(string *)&local_1f8);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_218);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    for (pptVar8 = (local_240->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar8 !=
        (local_240->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar8 = pptVar8 + 1) {
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
      ptVar7 = (t_type *)0x0;
      type_name_abi_cxx11_(&local_1c8,this,(*pptVar8)->type_,false,false,false,false);
      std::operator+(&local_218,"private ",&local_1c8);
      std::operator+(&local_238,&local_218," ");
      std::operator+(&local_268,&local_238,&(*pptVar8)->name_);
      std::operator+(&local_1f8,&local_268,";");
      poVar5 = std::operator<<(poVar5,(string *)&local_1f8);
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_1c8);
    }
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
    std::operator+(&local_238,"public ",&funclassname);
    std::operator+(&local_268,&local_238,"(");
    async_argument_list_abi_cxx11_(&local_218,this,*local_248,local_240,ptVar7,true);
    std::operator+(&local_1f8,&local_268,&local_218);
    poVar5 = std::operator<<(poVar5,(string *)&local_1f8);
    poVar5 = std::operator<<(poVar5,
                             ", org.apache.thrift.async.TAsyncClient client, org.apache.thrift.protocol.TProtocolFactory protocolFactory, org.apache.thrift.transport.TNonblockingTransport transport) throws org.apache.thrift.TException {"
                            );
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_238);
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar5 = std::operator<<(poVar5,"  super(client, protocolFactory, transport, resultHandler, ");
    pcVar6 = "false";
    if ((*local_248)->oneway_ != false) {
      pcVar6 = "true";
    }
    poVar5 = std::operator<<(poVar5,pcVar6);
    poVar5 = std::operator<<(poVar5,");");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    for (pptVar8 = (local_240->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar8 !=
        (local_240->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar8 = pptVar8 + 1) {
      poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
      std::operator+(&local_218,"  this.",&(*pptVar8)->name_);
      std::operator+(&local_238,&local_218," = ");
      std::operator+(&local_268,&local_238,&(*pptVar8)->name_);
      std::operator+(&local_1f8,&local_268,";");
      poVar5 = std::operator<<(poVar5,(string *)&local_1f8);
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_218);
    }
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar5 = std::operator<<(poVar5,"}");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar5 = std::operator<<(poVar5,
                             "public void write_args(org.apache.thrift.protocol.TProtocol prot) throws org.apache.thrift.TException {"
                            );
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&local_1f8,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)os,(string *)&local_1f8);
    poVar5 = std::operator<<(poVar5,
                             "prot.writeMessageBegin(new org.apache.thrift.protocol.TMessage(\"");
    poVar5 = std::operator<<(poVar5,(string *)&funname);
    poVar5 = std::operator<<(poVar5,"\", org.apache.thrift.protocol.");
    pcVar6 = "TMessageType.CALL";
    if ((*local_248)->oneway_ != false) {
      pcVar6 = "TMessageType.ONEWAY";
    }
    poVar5 = std::operator<<(poVar5,pcVar6);
    poVar5 = std::operator<<(poVar5,", 0));");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_268,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_268);
    poVar5 = std::operator<<(poVar5,(string *)&args_name);
    poVar5 = std::operator<<(poVar5," args = new ");
    poVar5 = std::operator<<(poVar5,(string *)&args_name);
    poVar5 = std::operator<<(poVar5,"();");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_1f8);
    for (pptVar8 = (local_240->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar8 !=
        (local_240->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar8 = pptVar8 + 1) {
      t_generator::indent_abi_cxx11_(&local_1f8,(t_generator *)this);
      poVar5 = std::operator<<((ostream *)os,(string *)&local_1f8);
      poVar5 = std::operator<<(poVar5,"args.set");
      std::__cxx11::string::string((string *)&local_b0,(string *)&(*pptVar8)->name_);
      get_cap_name(&local_268,this,&local_b0);
      poVar5 = std::operator<<(poVar5,(string *)&local_268);
      poVar5 = std::operator<<(poVar5,"(");
      poVar5 = std::operator<<(poVar5,(string *)&(*pptVar8)->name_);
      poVar5 = std::operator<<(poVar5,");");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_1f8);
    }
    t_generator::indent_abi_cxx11_(&local_1f8,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)os,(string *)&local_1f8);
    poVar5 = std::operator<<(poVar5,"args.write(prot);");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_268,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_268);
    poVar5 = std::operator<<(poVar5,"prot.writeMessageEnd();");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_1f8);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar5 = std::operator<<(poVar5,"}");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
    type_name_abi_cxx11_(&local_238,this,local_1d8,true,false,false,false);
    std::operator+(&local_268,"public ",&local_238);
    std::operator+(&local_1f8,&local_268," getResult() throws ");
    std::operator<<(poVar5,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_238);
    for (pptVar8 = (local_1d0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar8 !=
        (local_1d0->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar8 = pptVar8 + 1) {
      type_name_abi_cxx11_(&local_268,this,(*pptVar8)->type_,false,false,false,false);
      std::operator+(&local_1f8,&local_268,", ");
      std::operator<<((ostream *)os,(string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_268);
    }
    poVar5 = std::operator<<((ostream *)os,"org.apache.thrift.TException {");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&local_1f8,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)os,(string *)&local_1f8);
    poVar5 = std::operator<<(poVar5,
                             "if (getState() != org.apache.thrift.async.TAsyncMethodCall.State.RESPONSE_READ) {"
                            );
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_268,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_268);
    poVar5 = std::operator<<(poVar5,
                             "  throw new java.lang.IllegalStateException(\"Method call not finished!\");"
                            );
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_238,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_238);
    poVar5 = std::operator<<(poVar5,"}");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_218,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_218);
    poVar5 = std::operator<<(poVar5,
                             "org.apache.thrift.transport.TMemoryInputTransport memoryTransport = new org.apache.thrift.transport.TMemoryInputTransport(getFrameBuffer().array());"
                            );
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_1c8,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_1c8);
    poVar5 = std::operator<<(poVar5,
                             "org.apache.thrift.protocol.TProtocol prot = client.getProtocolFactory().getProtocol(memoryTransport);"
                            );
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_1f8);
    t_generator::indent((t_generator *)this,(ostream *)os);
    iVar4 = (*(local_1d8->super_t_doc)._vptr_t_doc[4])();
    if ((char)iVar4 == '\0') {
      std::operator+(&local_238,"return (new Client(prot)).recv",&sep);
      std::operator+(&local_268,&local_238,&javaname);
      std::operator+(&local_1f8,&local_268,"();");
      poVar5 = std::operator<<((ostream *)os,(string *)&local_1f8);
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_238);
    }
    else {
      poVar5 = std::operator<<((ostream *)os,"return null;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar5 = std::operator<<(poVar5,"}");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar5 = std::operator<<(poVar5,"}");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&result_name);
    std::__cxx11::string::~string((string *)&args_name);
    std::__cxx11::string::~string((string *)&funclassname);
    std::__cxx11::string::~string((string *)&javaname);
    std::__cxx11::string::~string((string *)&sep);
    std::__cxx11::string::~string((string *)&funname);
    functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
    super__Vector_impl_data._M_start = local_248 + 1;
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)os);
  std::operator<<((ostream *)os,(string *)&::endl_abi_cxx11_);
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base
            (&functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>);
  std::__cxx11::string::~string((string *)&extends_client);
  std::__cxx11::string::~string((string *)&extends);
  return;
}

Assistant:

void t_java_generator::generate_service_async_client(t_service* tservice) {
  string extends = "org.apache.thrift.async.TAsyncClient";
  string extends_client = "";
  if (tservice->get_extends() != nullptr) {
    extends = type_name(tservice->get_extends()) + ".AsyncClient";
  }

  indent(f_service_) << "public static class AsyncClient extends " << extends
                     << " implements AsyncIface {" << endl;
  indent_up();

  // Factory method
  indent(f_service_) << "public static class Factory implements "
                        "org.apache.thrift.async.TAsyncClientFactory<AsyncClient> {" << endl;
  indent(f_service_) << "  private org.apache.thrift.async.TAsyncClientManager clientManager;"
                     << endl;
  indent(f_service_) << "  private org.apache.thrift.protocol.TProtocolFactory protocolFactory;"
                     << endl;
  indent(f_service_) << "  public Factory(org.apache.thrift.async.TAsyncClientManager "
                        "clientManager, org.apache.thrift.protocol.TProtocolFactory "
                        "protocolFactory) {" << endl;
  indent(f_service_) << "    this.clientManager = clientManager;" << endl;
  indent(f_service_) << "    this.protocolFactory = protocolFactory;" << endl;
  indent(f_service_) << "  }" << endl;
  indent(f_service_) << "  public AsyncClient "
                        "getAsyncClient(org.apache.thrift.transport.TNonblockingTransport "
                        "transport) {" << endl;
  indent(f_service_) << "    return new AsyncClient(protocolFactory, clientManager, transport);"
                     << endl;
  indent(f_service_) << "  }" << endl;
  indent(f_service_) << "}" << endl << endl;

  indent(f_service_) << "public AsyncClient(org.apache.thrift.protocol.TProtocolFactory "
                        "protocolFactory, org.apache.thrift.async.TAsyncClientManager "
                        "clientManager, org.apache.thrift.transport.TNonblockingTransport "
                        "transport) {" << endl;
  indent(f_service_) << "  super(protocolFactory, clientManager, transport);" << endl;
  indent(f_service_) << "}" << endl << endl;

  // Generate client method implementations
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::const_iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    string funname = (*f_iter)->get_name();
    string sep = "_";
    string javaname = funname;
    if (fullcamel_style_) {
      sep = "";
      javaname = as_camel_case(javaname);
    }
    t_type* ret_type = (*f_iter)->get_returntype();
    t_struct* arg_struct = (*f_iter)->get_arglist();
    string funclassname = funname + "_call";
    const vector<t_field*>& fields = arg_struct->get_members();
    const std::vector<t_field*>& xceptions = (*f_iter)->get_xceptions()->get_members();
    vector<t_field*>::const_iterator fld_iter;
    string args_name = (*f_iter)->get_name() + "_args";
    string result_name = (*f_iter)->get_name() + "_result";

    // Main method body
    indent(f_service_) << "public " << function_signature_async(*f_iter, false)
                       << " throws org.apache.thrift.TException {" << endl;
    indent(f_service_) << "  checkReady();" << endl;
    indent(f_service_) << "  " << funclassname << " method_call = new " + funclassname + "("
                       << async_argument_list(*f_iter, arg_struct, ret_type)
                       << ", this, ___protocolFactory, ___transport);" << endl;
    indent(f_service_) << "  this.___currentMethod = method_call;" << endl;
    indent(f_service_) << "  ___manager.call(method_call);" << endl;
    indent(f_service_) << "}" << endl;

    f_service_ << endl;

    // TAsyncMethod object for this function call
    indent(f_service_) << "public static class " + funclassname
                          + " extends org.apache.thrift.async.TAsyncMethodCall<"
                          + type_name((*f_iter)->get_returntype(), true) + "> {" << endl;
    indent_up();

    // Member variables
    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      indent(f_service_) << "private " + type_name((*fld_iter)->get_type()) + " "
                            + (*fld_iter)->get_name() + ";" << endl;
    }

    // NOTE since we use a new Client instance to deserialize, let's keep seqid to 0 for now
    // indent(f_service_) << "private int seqid;" << endl << endl;

    // Constructor
    indent(f_service_) << "public " + funclassname + "("
                          + async_argument_list(*f_iter, arg_struct, ret_type, true)
                       << ", org.apache.thrift.async.TAsyncClient client, "
                          "org.apache.thrift.protocol.TProtocolFactory protocolFactory, "
                          "org.apache.thrift.transport.TNonblockingTransport transport) throws "
                          "org.apache.thrift.TException {" << endl;
    indent(f_service_) << "  super(client, protocolFactory, transport, resultHandler, "
                       << ((*f_iter)->is_oneway() ? "true" : "false") << ");" << endl;

    // Assign member variables
    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      indent(f_service_) << "  this." + (*fld_iter)->get_name() + " = " + (*fld_iter)->get_name()
                            + ";" << endl;
    }

    indent(f_service_) << "}" << endl << endl;

    indent(f_service_) << "public void write_args(org.apache.thrift.protocol.TProtocol prot) "
                          "throws org.apache.thrift.TException {" << endl;
    indent_up();

    // Serialize request
    // NOTE we are leaving seqid as 0, for now (see above)
    f_service_ << indent() << "prot.writeMessageBegin(new org.apache.thrift.protocol.TMessage(\""
               << funname << "\", org.apache.thrift.protocol."
               << ((*f_iter)->is_oneway() ? "TMessageType.ONEWAY" : "TMessageType.CALL") << ", 0));"
               << endl << indent() << args_name << " args = new " << args_name << "();" << endl;

    for (fld_iter = fields.begin(); fld_iter != fields.end(); ++fld_iter) {
      f_service_ << indent() << "args.set" << get_cap_name((*fld_iter)->get_name()) << "("
                 << (*fld_iter)->get_name() << ");" << endl;
    }

    f_service_ << indent() << "args.write(prot);" << endl << indent() << "prot.writeMessageEnd();"
               << endl;

    indent_down();
    indent(f_service_) << "}" << endl << endl;

    // Return method
    indent(f_service_) << "public " + type_name(ret_type, true) + " getResult() throws ";
    vector<t_field*>::const_iterator x_iter;
    for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
      f_service_ << type_name((*x_iter)->get_type(), false, false) + ", ";
    }
    f_service_ << "org.apache.thrift.TException {" << endl;

    indent_up();
    f_service_
        << indent()
        << "if (getState() != org.apache.thrift.async.TAsyncMethodCall.State.RESPONSE_READ) {"
        << endl << indent() << "  throw new java.lang.IllegalStateException(\"Method call not finished!\");"
        << endl << indent() << "}" << endl << indent()
        << "org.apache.thrift.transport.TMemoryInputTransport memoryTransport = new "
           "org.apache.thrift.transport.TMemoryInputTransport(getFrameBuffer().array());" << endl
        << indent() << "org.apache.thrift.protocol.TProtocol prot = "
                       "client.getProtocolFactory().getProtocol(memoryTransport);" << endl;
    indent(f_service_);
    if (ret_type->is_void()) { // NB: Includes oneways which always return void.
      f_service_ << "return null;" << endl;
    } else {
      f_service_ << "return (new Client(prot)).recv" + sep + javaname + "();" << endl;
    }

    // Close function
    indent_down();
    indent(f_service_) << "}" << endl;

    // Close class
    indent_down();
    indent(f_service_) << "}" << endl << endl;
  }

  // Close AsyncClient
  scope_down(f_service_);
  f_service_ << endl;
}